

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O2

void __thiscall
Diligent::DXCompilerLibrary::DXCompilerLibrary
          (DXCompilerLibrary *this,DXCompilerTarget Target,char *LibName)

{
  char *__s;
  allocator<char> local_9;
  
  this->m_Target = Target;
  __s = "";
  if (LibName != (char *)0x0) {
    __s = LibName;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_LibName,__s,&local_9);
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_Library = (void *)0x0;
  *(undefined8 *)((long)&(this->m_LibraryMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_LibraryMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->m_Loaded)._M_base._M_i = false;
  this->m_DxcCreateInstance = (DxcCreateInstanceProc)0x0;
  (this->m_Version).Major = 0;
  (this->m_Version).Minor = 0;
  (this->m_MaxShaderModel).Major = 0;
  (this->m_MaxShaderModel).Minor = 0;
  return;
}

Assistant:

DXCompilerLibrary(DXCompilerTarget Target, const char* LibName) noexcept :
        m_Target{Target},
        m_LibName{LibName != nullptr ? LibName : ""}
    {
    }